

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.c
# Opt level: O0

int lre_exec(uint8_t **capture,uint8_t *bc_buf,uint8_t *cbuf,int cindex,int clen,int cbuf_type,
            void *opaque)

{
  byte bVar1;
  long lVar2;
  intptr_t iVar3;
  bool bVar4;
  undefined8 uStack_c0;
  undefined4 auStack_b8 [2];
  undefined8 uStack_b0;
  uint8_t *local_a8;
  size_t local_a0;
  StackInt *stack_buf;
  int ret;
  int alloca_size;
  int i;
  int re_flags;
  REExecContext *s;
  REExecContext s_s;
  int cbuf_type_local;
  int clen_local;
  int cindex_local;
  uint8_t *cbuf_local;
  uint8_t *bc_buf_local;
  uint8_t **capture_local;
  
  s_s.state_stack_len._4_4_ = cbuf_type;
  _i = &s;
  bVar1 = *bc_buf;
  alloca_size = (uint)bVar1;
  s_s.capture_count = (uint)((bVar1 & 4) != 0);
  s_s.stack_size_max = (uint)((bVar1 & 2) != 0);
  s_s.multi_line = (BOOL)((bVar1 & 0x10) != 0);
  s_s.cbuf_end._4_4_ = (uint)bc_buf[1];
  s_s.cbuf_type = (int)bc_buf[2];
  s_s.cbuf = cbuf + (clen << ((byte)cbuf_type & 0x1f));
  bVar4 = (int)s_s.cbuf_end == 1;
  s_s.cbuf_end._0_4_ = cbuf_type;
  if ((bVar4) && (s_s.multi_line != 0)) {
    s_s.cbuf_end._0_4_ = 2;
  }
  s_s._32_8_ = opaque;
  s_s.opaque = (void *)((long)(int)s_s.cbuf_end._4_4_ * 0x10 + 0x20 + (long)s_s.cbuf_type * 8);
  s_s.state_size = 0;
  s_s.state_stack_size = 0;
  s_s.state_stack = (uint8_t *)0x0;
  for (ret = 0; SBORROW4(ret,s_s.cbuf_end._4_4_ * 2) != (int)(ret + s_s.cbuf_end._4_4_ * -2) < 0;
      ret = ret + 1) {
    capture[ret] = (uint8_t *)0x0;
  }
  stack_buf._4_4_ = s_s.cbuf_type << 3;
  lVar2 = -((long)(s_s.cbuf_type << 3) + 0xfU & 0xfffffffffffffff0);
  local_a0 = (long)&local_a8 + lVar2;
  local_a8 = cbuf;
  s = (REExecContext *)cbuf;
  *(undefined4 *)((long)auStack_b8 + lVar2) = 0;
  *(undefined8 *)((long)&uStack_c0 + lVar2) = 0x1c8679;
  iVar3 = lre_exec_backtrack(*(REExecContext **)(&stack0x00000088 + lVar2),
                             *(uint8_t ***)(&stack0x00000080 + lVar2),
                             *(StackInt **)(&stack0x00000078 + lVar2),
                             *(int *)(&stack0x00000074 + lVar2),
                             *(uint8_t **)(&stack0x00000068 + lVar2),
                             *(uint8_t **)(&stack0x00000060 + lVar2),
                             *(BOOL *)(&stack0x000000a0 + lVar2));
  stack_buf._0_4_ = (int)iVar3;
  *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1c869c;
  lre_realloc(*(void **)((long)&ret + lVar2),*(void **)((long)&stack_buf + lVar2),
              *(size_t *)((long)&local_a0 + lVar2));
  return (int)stack_buf;
}

Assistant:

int lre_exec(uint8_t **capture,
             const uint8_t *bc_buf, const uint8_t *cbuf, int cindex, int clen,
             int cbuf_type, void *opaque)
{
    REExecContext s_s, *s = &s_s;
    int re_flags, i, alloca_size, ret;
    StackInt *stack_buf;
    
    re_flags = bc_buf[RE_HEADER_FLAGS];
    s->multi_line = (re_flags & LRE_FLAG_MULTILINE) != 0;
    s->ignore_case = (re_flags & LRE_FLAG_IGNORECASE) != 0;
    s->is_utf16 = (re_flags & LRE_FLAG_UTF16) != 0;
    s->capture_count = bc_buf[RE_HEADER_CAPTURE_COUNT];
    s->stack_size_max = bc_buf[RE_HEADER_STACK_SIZE];
    s->cbuf = cbuf;
    s->cbuf_end = cbuf + (clen << cbuf_type);
    s->cbuf_type = cbuf_type;
    if (s->cbuf_type == 1 && s->is_utf16)
        s->cbuf_type = 2;
    s->opaque = opaque;

    s->state_size = sizeof(REExecState) +
        s->capture_count * sizeof(capture[0]) * 2 +
        s->stack_size_max * sizeof(stack_buf[0]);
    s->state_stack = NULL;
    s->state_stack_len = 0;
    s->state_stack_size = 0;
    
    for(i = 0; i < s->capture_count * 2; i++)
        capture[i] = NULL;
    alloca_size = s->stack_size_max * sizeof(stack_buf[0]);
    stack_buf = alloca(alloca_size);
    ret = lre_exec_backtrack(s, capture, stack_buf, 0, bc_buf + RE_HEADER_LEN,
                             cbuf + (cindex << cbuf_type), FALSE);
    lre_realloc(s->opaque, s->state_stack, 0);
    return ret;
}